

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChAssembly.cpp
# Opt level: O3

void __thiscall
chrono::ChAssembly::InjectConstraints(ChAssembly *this,ChSystemDescriptor *mdescriptor)

{
  pointer psVar1;
  element_type *peVar2;
  pointer psVar3;
  element_type *peVar4;
  pointer psVar5;
  element_type *peVar6;
  pointer psVar7;
  element_type *peVar8;
  pointer psVar9;
  element_type *peVar10;
  shared_ptr<chrono::ChBody> *body;
  pointer psVar11;
  pointer psVar12;
  pointer psVar13;
  pointer psVar14;
  pointer psVar15;
  
  psVar1 = (this->bodylist).
           super__Vector_base<std::shared_ptr<chrono::ChBody>,_std::allocator<std::shared_ptr<chrono::ChBody>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (psVar11 = (this->bodylist).
                 super__Vector_base<std::shared_ptr<chrono::ChBody>,_std::allocator<std::shared_ptr<chrono::ChBody>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; psVar11 != psVar1; psVar11 = psVar11 + 1
      ) {
    peVar2 = (psVar11->super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    (*(peVar2->super_ChPhysicsItem).super_ChObj._vptr_ChObj[0x31])(peVar2,mdescriptor);
  }
  psVar3 = (this->shaftlist).
           super__Vector_base<std::shared_ptr<chrono::ChShaft>,_std::allocator<std::shared_ptr<chrono::ChShaft>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (psVar12 = (this->shaftlist).
                 super__Vector_base<std::shared_ptr<chrono::ChShaft>,_std::allocator<std::shared_ptr<chrono::ChShaft>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; psVar12 != psVar3; psVar12 = psVar12 + 1
      ) {
    peVar4 = (psVar12->super___shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    (*(peVar4->super_ChPhysicsItem).super_ChObj._vptr_ChObj[0x31])(peVar4,mdescriptor);
  }
  psVar5 = (this->linklist).
           super__Vector_base<std::shared_ptr<chrono::ChLinkBase>,_std::allocator<std::shared_ptr<chrono::ChLinkBase>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (psVar13 = (this->linklist).
                 super__Vector_base<std::shared_ptr<chrono::ChLinkBase>,_std::allocator<std::shared_ptr<chrono::ChLinkBase>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; psVar13 != psVar5; psVar13 = psVar13 + 1
      ) {
    peVar6 = (psVar13->super___shared_ptr<chrono::ChLinkBase,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    (*(peVar6->super_ChPhysicsItem).super_ChObj._vptr_ChObj[0x31])(peVar6,mdescriptor);
  }
  psVar7 = (this->meshlist).
           super__Vector_base<std::shared_ptr<chrono::fea::ChMesh>,_std::allocator<std::shared_ptr<chrono::fea::ChMesh>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (psVar14 = (this->meshlist).
                 super__Vector_base<std::shared_ptr<chrono::fea::ChMesh>,_std::allocator<std::shared_ptr<chrono::fea::ChMesh>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; psVar14 != psVar7; psVar14 = psVar14 + 1
      ) {
    peVar8 = (psVar14->super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    (*(peVar8->super_ChIndexedNodes).super_ChPhysicsItem.super_ChObj._vptr_ChObj[0x31])
              (peVar8,mdescriptor);
  }
  psVar9 = (this->otherphysicslist).
           super__Vector_base<std::shared_ptr<chrono::ChPhysicsItem>,_std::allocator<std::shared_ptr<chrono::ChPhysicsItem>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (psVar15 = (this->otherphysicslist).
                 super__Vector_base<std::shared_ptr<chrono::ChPhysicsItem>,_std::allocator<std::shared_ptr<chrono::ChPhysicsItem>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; psVar15 != psVar9; psVar15 = psVar15 + 1
      ) {
    peVar10 = (psVar15->super___shared_ptr<chrono::ChPhysicsItem,_(__gnu_cxx::_Lock_policy)2>).
              _M_ptr;
    (*(peVar10->super_ChObj)._vptr_ChObj[0x31])(peVar10,mdescriptor);
  }
  return;
}

Assistant:

void ChAssembly::InjectConstraints(ChSystemDescriptor& mdescriptor) {
    for (auto& body : bodylist) {
        body->InjectConstraints(mdescriptor);
    }
    for (auto& shaft : shaftlist) {
        shaft->InjectConstraints(mdescriptor);
    }
    for (auto& link : linklist) {
        link->InjectConstraints(mdescriptor);
    }
    for (auto& mesh : meshlist) {
        mesh->InjectConstraints(mdescriptor);
    }
    for (auto& item : otherphysicslist) {
        item->InjectConstraints(mdescriptor);
    }
}